

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O0

void UnitTest::CheckEqual<double,double>
               (TestResults *results,double *expected,double *actual,TestDetails *details)

{
  undefined8 test;
  ostream *poVar1;
  char *failure;
  undefined1 local_1c0 [8];
  MemoryOutStream stream;
  TestDetails *details_local;
  double *actual_local;
  double *expected_local;
  TestResults *results_local;
  
  if ((*expected != *actual) || (NAN(*expected) || NAN(*actual))) {
    stream._400_8_ = details;
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    poVar1 = std::operator<<((ostream *)local_1c0,"Expected ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*expected);
    poVar1 = std::operator<<(poVar1," but was ");
    std::ostream::operator<<(poVar1,*actual);
    test = stream._400_8_;
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,(TestDetails *)test,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}